

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O2

bool __thiscall llvm::Triple::hasEnvironment(Triple *this)

{
  StringRef SVar1;
  
  SVar1 = getEnvironmentName(this);
  return SVar1.Length != 0;
}

Assistant:

bool hasEnvironment() const {
    return getEnvironmentName() != "";
  }